

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

section * __thiscall ELFIO::elfio::create_section(elfio *this)

{
  uchar uVar1;
  section_impl<ELFIO::Elf64_Shdr> *this_00;
  section *new_section;
  
  uVar1 = get_class(this);
  if (uVar1 == '\x01') {
    this_00 = (section_impl<ELFIO::Elf64_Shdr> *)operator_new(0x68);
    section_impl<ELFIO::Elf32_Shdr>::section_impl
              ((section_impl<ELFIO::Elf32_Shdr> *)this_00,
               (endianess_convertor)SUB41(*(undefined4 *)&this->convertor,0));
  }
  else {
    if (uVar1 != '\x02') {
      return (section *)0x0;
    }
    this_00 = (section_impl<ELFIO::Elf64_Shdr> *)operator_new(0x80);
    section_impl<ELFIO::Elf64_Shdr>::section_impl
              (this_00,(endianess_convertor)SUB41(*(undefined4 *)&this->convertor,0));
  }
  new_section = &this_00->super_section;
  (*(this_00->super_section)._vptr_section[0x1e])
            (this_00,(ulong)((uint)(*(int *)&(this->sections_).
                                             super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                   *(int *)&(this->sections_).
                                            super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff
                            ));
  std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::push_back
            (&this->sections_,&new_section);
  return new_section;
}

Assistant:

section* create_section()
    {
        section*      new_section;
        unsigned char file_class = get_class();

        if ( file_class == ELFCLASS64 ) {
            new_section = new section_impl<Elf64_Shdr>( convertor );
        }
        else if ( file_class == ELFCLASS32 ) {
            new_section = new section_impl<Elf32_Shdr>( convertor );
        }
        else {
            return 0;
        }

        new_section->set_index( (Elf_Half)sections_.size() );
        sections_.push_back( new_section );

        return new_section;
    }